

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

ostream * IO::operator<<(ostream *output,Element *element)

{
  ostream *poVar1;
  Element *element_local;
  ostream *output_local;
  
  poVar1 = std::operator<<(output,"(");
  poVar1 = std::operator<<(poVar1,(string *)element);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,element->atomicWeight_);
  std::operator<<(poVar1,")");
  return output;
}

Assistant:

ostream& operator<<(ostream& output, const Element& element)
    {
        output << "(" << element.name_ << ", " << element.atomicWeight_ << ")";
        return output;
    }